

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O1

void __thiscall Clone_modelWithComponents_Test::TestBody(Clone_modelWithComponents_Test *this)

{
  string *psVar1;
  ModelPtr mClone;
  ComponentPtr c;
  ModelPtr m;
  ComponentPtr c2;
  ComponentPtr c1;
  long *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_60 [2];
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  psVar1 = local_40;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"unique_model","");
  libcellml::Entity::setId(psVar1);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  psVar1 = local_40;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  psVar1 = local_50;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"unique","");
  libcellml::Entity::setId(psVar1);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  psVar1 = local_50;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"copy","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"child_1","");
  libcellml::NamedEntity::setName(local_20);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"child_2","");
  libcellml::NamedEntity::setName(local_30);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_50);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_50);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_40);
  libcellml::Model::clone();
  compareModel((shared_ptr *)&local_40,(shared_ptr *)&local_70);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

TEST(Clone, modelWithComponents)
{
    auto m = libcellml::Model::create();
    m->setId("unique_model");
    m->setName("model");

    auto c = libcellml::Component::create();
    auto c1 = libcellml::Component::create();
    auto c2 = libcellml::Component::create();

    c->setId("unique");
    c->setName("copy");
    c1->setName("child_1");
    c2->setName("child_2");

    c->addComponent(c1);
    c->addComponent(c2);

    m->addComponent(c);

    auto mClone = m->clone();

    compareModel(m, mClone);
}